

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O0

void ecx_SDOinfoerror(ecx_contextt *context,uint16 Slave,uint16 Index,uint8 SubIdx,int32 AbortCode)

{
  undefined1 local_38 [8];
  ec_errort Ec;
  int32 AbortCode_local;
  uint8 SubIdx_local;
  uint16 Index_local;
  uint16 Slave_local;
  ecx_contextt *context_local;
  
  *context->ecaterror = '\x01';
  Ec.Signal = '\x04';
  Ec._9_1_ = 0;
  Ec.Slave = 0;
  Ec.Time.sec._2_2_ = Slave;
  Ec.Time.usec._0_2_ = Index;
  Ec.Time.usec._2_1_ = SubIdx;
  Ec._12_4_ = AbortCode;
  Ec.field_6.AbortCode = AbortCode;
  Ec.field_6.field_1.w2._1_1_ = SubIdx;
  ecx_pusherror(context,(ec_errort *)local_38);
  return;
}

Assistant:

static void ecx_SDOinfoerror(ecx_contextt *context, uint16 Slave, uint16 Index, uint8 SubIdx, int32 AbortCode)
{
   ec_errort Ec;

   Ec.Slave = Slave;
   Ec.Index = Index;
   Ec.SubIdx = SubIdx;
   *(context->ecaterror) = TRUE;
   Ec.Etype = EC_ERR_TYPE_SDOINFO_ERROR;
   Ec.AbortCode = AbortCode;
   ecx_pusherror(context, &Ec);
}